

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O0

int vkt::wsi::anon_unknown_0::Programs::init(EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *this;
  int iVar1;
  ProgramSources *pPVar2;
  allocator<char> local_129;
  string local_128;
  ShaderSource local_108;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  ShaderSource local_90;
  allocator<char> local_51;
  string local_50;
  EVP_PKEY_CTX *local_30;
  SourceCollections *dst_local;
  TestConfig param_1_local;
  
  local_30 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"quad-vert",&local_51);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)ctx,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "#version 450\nout gl_PerVertex {\n\tvec4 gl_Position;\n};\nhighp float;\nvoid main (void) {\n\tgl_Position = vec4(((gl_VertexIndex + 2) / 3) % 2 == 0 ? -1.0 : 1.0,\n\t                   ((gl_VertexIndex + 1) / 3) % 2 == 0 ? -1.0 : 1.0, 0.0, 1.0);\n}\n"
             ,&local_b1);
  glu::VertexSource::VertexSource((VertexSource *)&local_90,&local_b0);
  glu::ProgramSources::operator<<(pPVar2,&local_90);
  glu::VertexSource::~VertexSource((VertexSource *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  this = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"quad-frag",&local_d9);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,
             "#version 310 es\nlayout(location = 0) out highp vec4 o_color;\nlayout(push_constant) uniform PushConstant {\n\thighp uint frameNdx;\n} pushConstants;\nvoid main (void)\n{\n\thighp uint frameNdx = pushConstants.frameNdx;\n\thighp uint x = frameNdx + uint(gl_FragCoord.x);\n\thighp uint y = frameNdx + uint(gl_FragCoord.y);\n\thighp uint r = 128u * bitfieldExtract(x, 0, 1)\n\t             +  64u * bitfieldExtract(y, 1, 1)\n\t             +  32u * bitfieldExtract(x, 3, 1);\n\thighp uint g = 128u * bitfieldExtract(y, 0, 1)\n\t             +  64u * bitfieldExtract(x, 2, 1)\n\t             +  32u * bitfieldExtract(y, 3, 1);\n\thighp uint b = 128u * bitfieldExtract(x, 1, 1)\n\t             +  64u * bitfieldExtract(y, 2, 1)\n\t             +  32u * bitfieldExtract(x, 4, 1);\n\to_color = vec4(float(r) / 255.0, float(g) / 255.0, float(b) / 255.0, 1.0);\n}\n"
             ,&local_129);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_108,&local_128);
  glu::ProgramSources::operator<<(pPVar2,&local_108);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar1 = std::allocator<char>::~allocator(&local_d9);
  return iVar1;
}

Assistant:

static void init (vk::SourceCollections& dst, TestConfig)
	{
		dst.glslSources.add("quad-vert") << glu::VertexSource(
			"#version 450\n"
			"out gl_PerVertex {\n"
			"\tvec4 gl_Position;\n"
			"};\n"
			"highp float;\n"
			"void main (void) {\n"
			"\tgl_Position = vec4(((gl_VertexIndex + 2) / 3) % 2 == 0 ? -1.0 : 1.0,\n"
			"\t                   ((gl_VertexIndex + 1) / 3) % 2 == 0 ? -1.0 : 1.0, 0.0, 1.0);\n"
			"}\n");
		dst.glslSources.add("quad-frag") << glu::FragmentSource(
			"#version 310 es\n"
			"layout(location = 0) out highp vec4 o_color;\n"
			"layout(push_constant) uniform PushConstant {\n"
			"\thighp uint frameNdx;\n"
			"} pushConstants;\n"
			"void main (void)\n"
			"{\n"
			"\thighp uint frameNdx = pushConstants.frameNdx;\n"
			"\thighp uint x = frameNdx + uint(gl_FragCoord.x);\n"
			"\thighp uint y = frameNdx + uint(gl_FragCoord.y);\n"
			"\thighp uint r = 128u * bitfieldExtract(x, 0, 1)\n"
			"\t             +  64u * bitfieldExtract(y, 1, 1)\n"
			"\t             +  32u * bitfieldExtract(x, 3, 1);\n"
			"\thighp uint g = 128u * bitfieldExtract(y, 0, 1)\n"
			"\t             +  64u * bitfieldExtract(x, 2, 1)\n"
			"\t             +  32u * bitfieldExtract(y, 3, 1);\n"
			"\thighp uint b = 128u * bitfieldExtract(x, 1, 1)\n"
			"\t             +  64u * bitfieldExtract(y, 2, 1)\n"
			"\t             +  32u * bitfieldExtract(x, 4, 1);\n"
			"\to_color = vec4(float(r) / 255.0, float(g) / 255.0, float(b) / 255.0, 1.0);\n"
			"}\n");
	}